

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-types.hh
# Opt level: O3

color4h tinyusdz::operator+(color4h *a,color4h *b)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  ushort uVar7;
  half hVar8;
  half hVar9;
  half hVar10;
  half hVar11;
  float fVar12;
  float fVar13;
  uint uVar14;
  float fVar15;
  float fVar16;
  uint uVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  
  uVar1 = (a->r).value;
  uVar14 = (uint)uVar1 << 0xd;
  if ((uVar14 & 0xf800000) == 0xf800000) {
    fVar15 = (float)(uVar14 | 0x70000000);
  }
  else if ((uVar14 & 0xf800000) == 0) {
    fVar15 = (float)(uVar14 | 0x38800000) + -6.1035156e-05;
  }
  else {
    fVar15 = (float)((uVar14 & 0xfffe000) + 0x38000000);
  }
  uVar14 = (uint)(b->r).value;
  uVar17 = uVar14 << 0xd;
  if ((uVar17 & 0xf800000) == 0xf800000) {
    fVar18 = (float)(uVar17 | 0x70000000);
  }
  else if ((uVar17 & 0xf800000) == 0) {
    fVar18 = (float)(uVar17 | 0x38800000) + -6.1035156e-05;
  }
  else {
    fVar18 = (float)((uVar17 & 0xfffe000) + 0x38000000);
  }
  uVar2 = (a->g).value;
  uVar3 = (b->g).value;
  uVar17 = (uint)uVar2 << 0xd;
  if ((uVar17 & 0xf800000) == 0xf800000) {
    fVar19 = (float)(uVar17 | 0x70000000);
  }
  else if ((uVar17 & 0xf800000) == 0) {
    fVar19 = (float)(uVar17 | 0x38800000) + -6.1035156e-05;
  }
  else {
    fVar19 = (float)((uVar17 & 0xfffe000) + 0x38000000);
  }
  uVar17 = (uint)uVar3 << 0xd;
  if ((uVar17 & 0xf800000) == 0xf800000) {
    fVar20 = (float)(uVar17 | 0x70000000);
  }
  else if ((uVar17 & 0xf800000) == 0) {
    fVar20 = (float)(uVar17 | 0x38800000) + -6.1035156e-05;
  }
  else {
    fVar20 = (float)((uVar17 & 0xfffe000) + 0x38000000);
  }
  uVar4 = (a->b).value;
  uVar5 = (b->b).value;
  uVar17 = (uint)uVar4 << 0xd;
  if ((uVar17 & 0xf800000) == 0xf800000) {
    fVar13 = (float)(uVar17 | 0x70000000);
  }
  else if ((uVar17 & 0xf800000) == 0) {
    fVar13 = (float)(uVar17 | 0x38800000) + -6.1035156e-05;
  }
  else {
    fVar13 = (float)((uVar17 & 0xfffe000) + 0x38000000);
  }
  uVar17 = (uint)uVar5 << 0xd;
  if ((uVar17 & 0xf800000) == 0xf800000) {
    fVar16 = (float)(uVar17 | 0x70000000);
  }
  else if ((uVar17 & 0xf800000) == 0) {
    fVar16 = (float)(uVar17 | 0x38800000) + -6.1035156e-05;
  }
  else {
    fVar16 = (float)((uVar17 & 0xfffe000) + 0x38000000);
  }
  uVar6 = (a->a).value;
  uVar7 = (b->a).value;
  uVar17 = (uint)uVar6 << 0xd;
  if ((uVar17 & 0xf800000) == 0xf800000) {
    fVar21 = (float)(uVar17 | 0x70000000);
  }
  else if ((uVar17 & 0xf800000) == 0) {
    fVar21 = (float)(uVar17 | 0x38800000) + -6.1035156e-05;
  }
  else {
    fVar21 = (float)((uVar17 & 0xfffe000) + 0x38000000);
  }
  uVar17 = (uint)uVar7 << 0xd;
  if ((uVar17 & 0xf800000) == 0xf800000) {
    fVar12 = (float)(uVar17 | 0x70000000);
  }
  else if ((uVar17 & 0xf800000) == 0) {
    fVar12 = (float)(uVar17 | 0x38800000) + -6.1035156e-05;
  }
  else {
    fVar12 = (float)((uVar17 & 0xfffe000) + 0x38000000);
  }
  hVar8 = value::float_to_half_full
                    ((float)((uint)fVar16 | (uVar5 & 0x8000) << 0x10) +
                     (float)((uint)fVar13 | (int)(short)uVar4 & 0x80000000U));
  hVar9 = value::float_to_half_full
                    ((float)((uint)fVar20 | (uVar3 & 0x8000) << 0x10) +
                     (float)((uint)fVar19 | (int)(short)uVar2 & 0x80000000U));
  hVar10 = value::float_to_half_full
                     ((float)((uint)fVar18 | (uVar14 & 0x8000) << 0x10) +
                      (float)((uint)fVar15 | (int)(short)uVar1 & 0x80000000U));
  hVar11 = value::float_to_half_full
                     ((float)((uVar7 & 0x8000) << 0x10 | (uint)fVar12) +
                      (float)((uint)fVar21 | (int)(short)uVar6 & 0x80000000U));
  return (color4h)((ulong)hVar10.value |
                  (ulong)hVar9.value << 0x10 |
                  (ulong)hVar8.value << 0x20 | (ulong)hVar11.value << 0x30);
}

Assistant:

half operator[](size_t idx) const { return *(&r + idx); }